

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O2

double __thiscall nivalis::Expr::operator()(Expr *this,double arg,Environment *env)

{
  initializer_list<double> __l;
  allocator_type local_41;
  double local_40;
  double local_38;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = arg;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,__l,&local_41);
  local_40 = detail::eval_ast(env,&this->ast,(vector<double,_std::allocator<double>_> *)&local_30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  return local_40;
}

Assistant:

double Expr::operator()(double arg, Environment& env) const {
    return detail::eval_ast(env, ast, {arg});
}